

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_objlen(lua_State *L,StkId ra,TValue *rb)

{
  Table *t;
  byte bVar1;
  lua_Unsigned lVar2;
  Table *local_60;
  Table *local_58;
  TValue *io_2;
  TValue *io_1;
  TValue *io;
  Table *h;
  TValue *tm;
  TValue *rb_local;
  StkId ra_local;
  lua_State *L_local;
  
  bVar1 = rb->tt_ & 0x3f;
  if (bVar1 == 4) {
    *(ulong *)ra = (ulong)(byte)(rb->value_).f[0xb];
    (ra->val).tt_ = '\x03';
  }
  else {
    if (bVar1 == 5) {
      t = (Table *)(rb->value_).gc;
      if (t->metatable == (Table *)0x0) {
        local_58 = (Table *)0x0;
      }
      else {
        if ((t->metatable->flags & 0x10) == 0) {
          local_60 = (Table *)luaT_gettm(t->metatable,TM_LEN,L->l_G->tmname[4]);
        }
        else {
          local_60 = (Table *)0x0;
        }
        local_58 = local_60;
      }
      h = local_58;
      if (local_58 == (Table *)0x0) {
        lVar2 = luaH_getn(t);
        (ra->val).value_.i = lVar2;
        (ra->val).tt_ = '\x03';
        return;
      }
    }
    else {
      if (bVar1 == 0x14) {
        (ra->val).value_ = *(Value *)((rb->value_).f + 0x10);
        (ra->val).tt_ = '\x03';
        return;
      }
      h = (Table *)luaT_gettmbyobj(L,rb,TM_LEN);
      if ((h->tt & 0xf) == 0) {
        luaG_typeerror(L,rb,"get length of");
      }
    }
    luaT_callTMres(L,(TValue *)h,rb,rb,ra);
  }
  return;
}

Assistant:

void luaV_objlen (lua_State *L, StkId ra, const TValue *rb) {
  const TValue *tm;
  switch (ttypetag(rb)) {
    case LUA_VTABLE: {
      Table *h = hvalue(rb);
      tm = fasttm(L, h->metatable, TM_LEN);
      if (tm) break;  /* metamethod? break switch to call it */
      setivalue(s2v(ra), luaH_getn(h));  /* else primitive len */
      return;
    }
    case LUA_VSHRSTR: {
      setivalue(s2v(ra), tsvalue(rb)->shrlen);
      return;
    }
    case LUA_VLNGSTR: {
      setivalue(s2v(ra), tsvalue(rb)->u.lnglen);
      return;
    }
    default: {  /* try metamethod */
      tm = luaT_gettmbyobj(L, rb, TM_LEN);
      if (l_unlikely(notm(tm)))  /* no metamethod? */
        luaG_typeerror(L, rb, "get length of");
      break;
    }
  }
  luaT_callTMres(L, tm, rb, rb, ra);
}